

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fNegativeTessellationTests.cpp
# Opt level: O1

void deqp::gles31::Functional::NegativeTestShared::invalid_program_state(NegativeTestContext *ctx)

{
  pointer pcVar1;
  pointer pcVar2;
  RenderContext *pRVar3;
  bool bVar4;
  ContextType ctxType;
  char *__s;
  mapped_type *pmVar5;
  TestLog *pTVar6;
  TestError *this;
  char *pcVar7;
  long lVar8;
  ProgramPipeline pipeline;
  TessellationEvaluationSource tessEvalSource;
  TessellationControlSource tessCtrlSource;
  FragmentSource frgSource;
  ShaderProgram fragProgram;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  args;
  ShaderProgram tessEvalProgram;
  ShaderProgram tessCtrlProgram;
  ProgramPipeline PStack_428;
  uint local_418;
  value_type local_410;
  uint local_3f0;
  value_type local_3e8;
  uint local_3c8;
  value_type local_3c0;
  undefined1 local_3a0 [152];
  GLuint local_308;
  bool local_2e0;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_2d0;
  undefined1 local_2a0 [144];
  vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_> local_210;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1f0;
  bool bStack_1e0;
  undefined8 uStack_1df;
  undefined1 local_1d0 [176];
  undefined1 local_120 [16];
  bool bStack_110;
  undefined8 uStack_10f;
  undefined1 local_100 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0 [4];
  vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_> local_70;
  undefined1 local_50 [24];
  bool bStack_38;
  
  checkTessellationSupport(ctx);
  ctxType.super_ApiType.m_bits = (ApiType)(*ctx->m_renderCtx->_vptr_RenderContext[2])();
  bVar4 = glu::contextSupports(ctxType,(ApiType)0x23);
  local_2d0._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_2d0._M_impl.super__Rb_tree_header._M_header;
  local_2d0._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_2d0._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_2d0._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_2d0._M_impl.super__Rb_tree_header._M_header._M_right =
       local_2d0._M_impl.super__Rb_tree_header._M_header._M_left;
  __s = glu::getGLSLVersionDeclaration(bVar4 | GLSL_VERSION_310_ES);
  pcVar1 = local_3a0 + 0x10;
  local_3a0._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_3a0,"GLSL_VERSION_STRING","");
  pmVar5 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         *)&local_2d0,(key_type *)local_3a0);
  pcVar7 = (char *)pmVar5->_M_string_length;
  strlen(__s);
  std::__cxx11::string::_M_replace((ulong)pmVar5,0,pcVar7,(ulong)__s);
  if ((pointer)local_3a0._0_8_ != pcVar1) {
    operator_delete((void *)local_3a0._0_8_,local_3a0._16_8_ + 1);
  }
  pcVar7 = "#extension GL_EXT_tessellation_shader : require";
  if (bVar4) {
    pcVar7 = "";
  }
  local_3a0._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_3a0,"GLSL_TESS_EXTENSION_STRING","");
  pmVar5 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         *)&local_2d0,(key_type *)local_3a0);
  std::__cxx11::string::_M_replace((ulong)pmVar5,0,(char *)pmVar5->_M_string_length,(ulong)pcVar7);
  if ((pointer)local_3a0._0_8_ != pcVar1) {
    operator_delete((void *)local_3a0._0_8_,local_3a0._16_8_ + 1);
  }
  pcVar2 = local_2a0 + 0x10;
  local_2a0._0_8_ = pcVar2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_2a0,
             "${GLSL_VERSION_STRING}\nprecision mediump float;\nlayout(location = 0) out mediump vec4 fragColor;\n\nvoid main (void)\n{\n\tfragColor = vec4(1.0);\n}\n"
             ,"");
  tcu::StringTemplate::StringTemplate((StringTemplate *)local_1d0,(string *)local_2a0);
  tcu::StringTemplate::specialize
            ((string *)local_3a0,(StringTemplate *)local_1d0,
             (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)&local_2d0);
  local_3c8 = 1;
  local_3c0._M_dataplus._M_p = (pointer)&local_3c0.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_3c0,local_3a0._0_8_,(pointer)(local_3a0._8_8_ + local_3a0._0_8_));
  if ((pointer)local_3a0._0_8_ != pcVar1) {
    operator_delete((void *)local_3a0._0_8_,local_3a0._16_8_ + 1);
  }
  tcu::StringTemplate::~StringTemplate((StringTemplate *)local_1d0);
  if ((pointer)local_2a0._0_8_ != pcVar2) {
    operator_delete((void *)local_2a0._0_8_,local_2a0._16_8_ + 1);
  }
  local_2a0._0_8_ = pcVar2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_2a0,
             "${GLSL_VERSION_STRING}\n${GLSL_TESS_EXTENSION_STRING}\nlayout (vertices=3) out;\n\nvoid main()\n{\n\tgl_out[gl_InvocationID].gl_Position = gl_in[gl_InvocationID].gl_Position;\n}\n"
             ,"");
  tcu::StringTemplate::StringTemplate((StringTemplate *)local_1d0,(string *)local_2a0);
  tcu::StringTemplate::specialize
            ((string *)local_3a0,(StringTemplate *)local_1d0,
             (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)&local_2d0);
  local_3f0 = 3;
  local_3e8._M_dataplus._M_p = (pointer)&local_3e8.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_3e8,local_3a0._0_8_,(pointer)(local_3a0._8_8_ + local_3a0._0_8_));
  if ((pointer)local_3a0._0_8_ != pcVar1) {
    operator_delete((void *)local_3a0._0_8_,local_3a0._16_8_ + 1);
  }
  tcu::StringTemplate::~StringTemplate((StringTemplate *)local_1d0);
  if ((pointer)local_2a0._0_8_ != pcVar2) {
    operator_delete((void *)local_2a0._0_8_,local_2a0._16_8_ + 1);
  }
  local_2a0._0_8_ = pcVar2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_2a0,
             "${GLSL_VERSION_STRING}\n${GLSL_TESS_EXTENSION_STRING}\nlayout(triangles) in;\n\nvoid main()\n{\n\tgl_Position = gl_TessCoord[0] * gl_in[0].gl_Position;\n}\n"
             ,"");
  tcu::StringTemplate::StringTemplate((StringTemplate *)local_1d0,(string *)local_2a0);
  tcu::StringTemplate::specialize
            ((string *)local_3a0,(StringTemplate *)local_1d0,
             (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)&local_2d0);
  local_418 = 4;
  local_410._M_dataplus._M_p = (pointer)&local_410.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_410,local_3a0._0_8_,(pointer)(local_3a0._8_8_ + local_3a0._0_8_));
  if ((pointer)local_3a0._0_8_ != pcVar1) {
    operator_delete((void *)local_3a0._0_8_,local_3a0._16_8_ + 1);
  }
  tcu::StringTemplate::~StringTemplate((StringTemplate *)local_1d0);
  if ((pointer)local_2a0._0_8_ != pcVar2) {
    operator_delete((void *)local_2a0._0_8_,local_2a0._16_8_ + 1);
  }
  glu::ProgramPipeline::ProgramPipeline(&PStack_428,ctx->m_renderCtx);
  pRVar3 = ctx->m_renderCtx;
  bStack_110 = false;
  uStack_10f = 0;
  local_120._0_8_ = (pointer)0x0;
  local_120[8] = '\0';
  local_120._9_7_ = 0;
  memset(local_1d0,0,0xac);
  uStack_10f._7_1_ = true;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(local_1d0 + (ulong)local_3c8 * 0x18),&local_3c0);
  glu::ShaderProgram::ShaderProgram((ShaderProgram *)local_3a0,pRVar3,(ProgramSources *)local_1d0);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_120);
  std::vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_>::~vector
            ((vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_> *)
             (local_1d0 + 0x90));
  lVar8 = 0x78;
  do {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(local_1d0 + lVar8));
    lVar8 = lVar8 + -0x18;
  } while (lVar8 != -0x18);
  pRVar3 = ctx->m_renderCtx;
  bStack_1e0 = false;
  uStack_1df = 0;
  local_1f0._M_allocated_capacity = 0;
  local_1f0._M_local_buf[8] = '\0';
  local_1f0._9_7_ = 0;
  memset(local_2a0,0,0xac);
  uStack_1df._7_1_ = true;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(local_2a0 + (ulong)local_3f0 * 0x18),&local_3e8);
  glu::ShaderProgram::ShaderProgram((ShaderProgram *)local_1d0,pRVar3,(ProgramSources *)local_2a0);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&local_1f0);
  std::vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_>::~vector
            (&local_210);
  lVar8 = 0x78;
  do {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(local_2a0 + lVar8));
    lVar8 = lVar8 + -0x18;
  } while (lVar8 != -0x18);
  pRVar3 = ctx->m_renderCtx;
  local_50[0x10] = 0;
  stack0xffffffffffffffc1 = 0;
  local_50._0_8_ = (pointer)0x0;
  local_50[8] = 0;
  local_50._9_7_ = 0;
  memset(local_100,0,0xac);
  bStack_38 = true;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(local_100 + (ulong)local_418 * 0x18),&local_410);
  glu::ShaderProgram::ShaderProgram((ShaderProgram *)local_2a0,pRVar3,(ProgramSources *)local_100);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_50);
  std::vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_>::~vector
            (&local_70);
  lVar8 = 0x78;
  do {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(local_100 + lVar8));
    lVar8 = lVar8 + -0x18;
  } while (lVar8 != -0x18);
  pTVar6 = glu::operator<<((ctx->super_CallLogWrapper).m_log,(ShaderProgram *)local_3a0);
  pTVar6 = glu::operator<<(pTVar6,(ShaderProgram *)local_1d0);
  glu::operator<<(pTVar6,(ShaderProgram *)local_2a0);
  if (((local_2e0 == true) && (bStack_110 == true)) && (bStack_1e0 != false)) {
    glu::CallLogWrapper::glBindProgramPipeline(&ctx->super_CallLogWrapper,PStack_428.m_pipeline);
    NegativeTestContext::expectError(ctx,0);
    glu::CallLogWrapper::glUseProgramStages
              (&ctx->super_CallLogWrapper,PStack_428.m_pipeline,2,local_308);
    glu::CallLogWrapper::glUseProgramStages
              (&ctx->super_CallLogWrapper,PStack_428.m_pipeline,8,local_1d0._152_4_);
    glu::CallLogWrapper::glUseProgramStages
              (&ctx->super_CallLogWrapper,PStack_428.m_pipeline,0x10,
               (GLuint)local_210.
                       super__Vector_base<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_>
                       ._M_impl.super__Vector_impl_data._M_finish);
    NegativeTestContext::expectError(ctx,0);
    local_100._0_8_ = local_f0;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_100,
               "GL_INVALID_OPERATION is generated if tessellation is active and vertex shader is missing."
               ,"");
    NegativeTestContext::beginSection(ctx,(string *)local_100);
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_100._0_8_ !=
        local_f0) {
      operator_delete((void *)local_100._0_8_,(ulong)(local_f0[0]._M_dataplus._M_p + 1));
    }
    glu::CallLogWrapper::glDrawArrays(&ctx->super_CallLogWrapper,0xe,0,3);
    NegativeTestContext::expectError(ctx,0x502);
    NegativeTestContext::endSection(ctx);
    glu::CallLogWrapper::glBindProgramPipeline(&ctx->super_CallLogWrapper,0);
    NegativeTestContext::expectError(ctx,0);
    glu::ShaderProgram::~ShaderProgram((ShaderProgram *)local_2a0);
    glu::ShaderProgram::~ShaderProgram((ShaderProgram *)local_1d0);
    glu::ShaderProgram::~ShaderProgram((ShaderProgram *)local_3a0);
    glu::ProgramPipeline::~ProgramPipeline(&PStack_428);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_410._M_dataplus._M_p != &local_410.field_2) {
      operator_delete(local_410._M_dataplus._M_p,local_410.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3e8._M_dataplus._M_p != &local_3e8.field_2) {
      operator_delete(local_3e8._M_dataplus._M_p,local_3e8.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3c0._M_dataplus._M_p != &local_3c0.field_2) {
      operator_delete(local_3c0._M_dataplus._M_p,local_3c0.field_2._M_allocated_capacity + 1);
    }
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~_Rb_tree(&local_2d0);
    return;
  }
  this = (TestError *)__cxa_allocate_exception(0x38);
  local_100._0_8_ = local_f0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_100,"failed to build program","");
  tcu::TestError::TestError(this,(string *)local_100);
  __cxa_throw(this,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

void invalid_program_state (NegativeTestContext& ctx)
{
	checkTessellationSupport(ctx);

	const bool					isES32	= glu::contextSupports(ctx.getRenderContext().getType(), glu::ApiType::es(3, 2));
	map<string, string>			args;
	args["GLSL_VERSION_STRING"]			= isES32 ? getGLSLVersionDeclaration(glu::GLSL_VERSION_320_ES) : getGLSLVersionDeclaration(glu::GLSL_VERSION_310_ES);
	args["GLSL_TESS_EXTENSION_STRING"]	= isES32 ? "" : "#extension GL_EXT_tessellation_shader : require";

	glu::FragmentSource frgSource(tcu::StringTemplate(fragmentShaderSource).specialize(args));
	glu::TessellationControlSource tessCtrlSource(tcu::StringTemplate(tessControlShaderSource).specialize(args));
	glu::TessellationEvaluationSource tessEvalSource(tcu::StringTemplate(tessEvalShaderSource).specialize(args));

	glu::ProgramPipeline pipeline(ctx.getRenderContext());

	glu::ShaderProgram	fragProgram	(ctx.getRenderContext(), glu::ProgramSources() << glu::ProgramSeparable(true) << frgSource);
	glu::ShaderProgram	tessCtrlProgram	(ctx.getRenderContext(), glu::ProgramSources() << glu::ProgramSeparable(true) << tessCtrlSource);
	glu::ShaderProgram	tessEvalProgram	(ctx.getRenderContext(), glu::ProgramSources() << glu::ProgramSeparable(true) << tessEvalSource);

	tcu::TestLog& log = ctx.getLog();
	log << fragProgram << tessCtrlProgram << tessEvalProgram;

	if (!fragProgram.isOk() || !tessCtrlProgram.isOk() || !tessEvalProgram.isOk())
		throw tcu::TestError("failed to build program");

	ctx.glBindProgramPipeline(pipeline.getPipeline());
	ctx.expectError(GL_NO_ERROR);

	ctx.glUseProgramStages(pipeline.getPipeline(), GL_FRAGMENT_SHADER_BIT, fragProgram.getProgram());
	ctx.glUseProgramStages(pipeline.getPipeline(), GL_TESS_CONTROL_SHADER_BIT, tessCtrlProgram.getProgram());
	ctx.glUseProgramStages(pipeline.getPipeline(), GL_TESS_EVALUATION_SHADER_BIT, tessEvalProgram.getProgram());
	ctx.expectError(GL_NO_ERROR);

	ctx.beginSection("GL_INVALID_OPERATION is generated if tessellation is active and vertex shader is missing.");
	ctx.glDrawArrays(GL_PATCHES, 0, 3);
	ctx.expectError(GL_INVALID_OPERATION);
	ctx.endSection();

	ctx.glBindProgramPipeline(0);
	ctx.expectError(GL_NO_ERROR);
}